

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Reader * __thiscall capnp::DynamicValue::Reader::operator=(Reader *this,Reader *other)

{
  if (this->type == CAPABILITY) {
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&(this->field_1).textValue);
  }
  Reader(this,other);
  return this;
}

Assistant:

DynamicValue::Reader& DynamicValue::Reader::operator=(Reader&& other) {
  if (type == CAPABILITY) {
    kj::dtor(capabilityValue);
  }
  kj::ctor(*this, kj::mv(other));
  return *this;
}